

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

void __thiscall jsonip::detail::struct_helper<P>::struct_helper(struct_helper<P> *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_struct_helper_base).super_helper._vptr_helper =
       (_func_int **)&PTR__struct_helper_base_0010fbc8;
  boost::mpl::aux::for_each_impl<false>::
  execute<boost::mpl::r_iter<mpl_::integral_c<int,0>>,boost::mpl::r_iter<mpl_::integral_c<int,2>>,boost::mpl::identity<mpl_::na>,jsonip::detail::struct_helper<P>::initializer>
            ((r_iter<mpl_::integral_c<int,_0>_> *)0x0,(r_iter<mpl_::integral_c<int,_2>_> *)0x0,
             (identity<mpl_::na> *)0x0,(initializer)this);
  return;
}

Assistant:

struct_helper()
        {
            boost::mpl::for_each<range_t>(initializer(*this));
        }